

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::Tarjan(cmComputeComponentGraph *this)

{
  bool bVar1;
  reference pvVar2;
  size_type local_38;
  size_t i;
  undefined1 local_28 [8];
  TarjanEntry entry;
  size_t n;
  cmComputeComponentGraph *this_local;
  
  entry.VisitIndex =
       std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                 (&this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                 );
  memset(local_28,0,0x10);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,0);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,entry.VisitIndex,(value_type *)local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->TarjanComponents,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->TarjanComponents,entry.VisitIndex,&INVALID_COMPONENT);
  this->TarjanWalkId = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->TarjanVisited,0);
  i = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->TarjanVisited,entry.VisitIndex,&i);
  local_38 = 0;
  do {
    if (entry.VisitIndex <= local_38) {
      return;
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->TarjanVisited,local_38);
    if (*pvVar2 == 0) {
      bVar1 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::empty(&this->TarjanStack);
      if (!bVar1) {
        __assert_fail("this->TarjanStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmComputeComponentGraph.cxx"
                      ,0x2d,"void cmComputeComponentGraph::Tarjan()");
      }
      this->TarjanWalkId = this->TarjanWalkId + 1;
      this->TarjanIndex = 0;
      TarjanVisit(this,local_38);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::Tarjan()
{
  size_t n = this->InputGraph.size();
  TarjanEntry entry = { 0, 0 };
  this->TarjanEntries.resize(0);
  this->TarjanEntries.resize(n, entry);
  this->TarjanComponents.resize(0);
  this->TarjanComponents.resize(n, INVALID_COMPONENT);
  this->TarjanWalkId = 0;
  this->TarjanVisited.resize(0);
  this->TarjanVisited.resize(n, 0);
  for (size_t i = 0; i < n; ++i) {
    // Start a new DFS from this node if it has never been visited.
    if (!this->TarjanVisited[i]) {
      assert(this->TarjanStack.empty());
      ++this->TarjanWalkId;
      this->TarjanIndex = 0;
      this->TarjanVisit(i);
    }
  }
}